

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

validation_message * __thiscall
jsoncons::jsonschema::
keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::make_validation_message
          (keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,json_pointer *eval_path,json_pointer *instance_location,string *message,
          vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
          *details)

{
  string *in_RCX;
  string *in_RDX;
  validation_message *in_RSI;
  validation_message *in_RDI;
  uri *in_R8;
  json_pointer *in_R9;
  vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  *unaff_retaddr;
  string *eval_path_00;
  
  eval_path_00 = in_RCX;
  std::__cxx11::string::empty();
  validation_message::validation_message
            (in_RSI,in_RDX,(json_pointer *)eval_path_00,in_R8,in_R9,in_RCX,unaff_retaddr);
  return in_RDI;
}

Assistant:

validation_message make_validation_message(const jsonpointer::json_pointer& eval_path,
            const jsonpointer::json_pointer& instance_location,
            const std::string& message,
            const std::vector<validation_message>& details) const override
        {
            return validation_message(keyword_name_, 
                eval_path,
                schema_location_, 
                instance_location, 
                custom_message_.empty() ? message : custom_message_,
                details);
        }